

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::varDeclarationList(Parse *this)

{
  int *piVar1;
  int iVar2;
  DelimiterTable *pDVar3;
  pointer pTVar4;
  _Alloc_hider _Var5;
  pointer pvVar6;
  pointer pcVar7;
  int iVar8;
  Type TVar9;
  uint uVar10;
  mapped_type *pmVar11;
  vector<Token,_std::allocator<Token>_> *pvVar12;
  long lVar13;
  ostream *poVar14;
  int iVar15;
  SymbolTable *pSVar16;
  long lVar17;
  long lVar18;
  undefined1 *puVar19;
  char *pcVar20;
  Parse *pPVar21;
  vector<QuadTuple,_std::allocator<QuadTuple>_> *pvVar22;
  string curName;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined8 local_148;
  _Bit_pointer puStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  double local_128;
  undefined8 uStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
    pDVar3 = this->delimiterTable;
    local_168._0_8_ = &local_158;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,",","");
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::operator[](&(pDVar3->
                            super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).index,(key_type *)local_168);
    iVar8 = *pmVar11;
    pvVar12 = this->tokenVec;
    iVar15 = this->curIndex;
    iVar2 = (pvVar12->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar15].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._0_8_ != &local_158) {
      operator_delete((void *)local_168._0_8_,local_158._M_allocated_capacity + 1);
      pvVar12 = this->tokenVec;
      iVar15 = this->curIndex;
    }
    if (iVar8 != iVar2) {
      if ((pvVar12->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar15].type == DELIMTER) {
        pDVar3 = this->delimiterTable;
        local_168._0_8_ = &local_158;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,anon_var_dwarf_33b7a + 0x12,anon_var_dwarf_33b7a + 0x13);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&(pDVar3->
                                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).index,(key_type *)local_168);
        iVar8 = *pmVar11;
        iVar15 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start[this->curIndex].id;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ != &local_158) {
          operator_delete((void *)local_168._0_8_,local_158._M_allocated_capacity + 1);
        }
        if (iVar8 == iVar15) {
          this->curIndex = this->curIndex + 1;
          return 1;
        }
      }
      goto LAB_0010b141;
    }
    iVar15 = iVar15 + 1;
    this->curIndex = iVar15;
    pTVar4 = (pvVar12->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pTVar4[iVar15].type == IDENTIFIER) {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      _Var5._M_p = pTVar4[iVar15].name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,_Var5._M_p,_Var5._M_p + pTVar4[iVar15].name._M_string_length);
      pSVar16 = this->st;
      pTVar4 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var5._M_p = pTVar4[this->curIndex].name._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,_Var5._M_p,
                 _Var5._M_p + pTVar4[this->curIndex].name._M_string_length);
      iVar8 = SymbolTable::searchSymbolName(pSVar16,&local_d0,this->curFun);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (-1 < iVar8) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_aa164 + 3,6);
        pTVar4 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pTVar4[this->curIndex].name._M_dataplus._M_p,
                             pTVar4[this->curIndex].name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,anon_var_dwarf_33ab0,9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,anon_var_dwarf_33df0 + 0x16,6);
        poVar14 = (ostream *)
                  std::ostream::operator<<
                            (poVar14,(this->tokenVec->
                                     super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                     super__Vector_impl_data._M_start[this->curIndex].line);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,anon_var_dwarf_33a7e,3);
        std::endl<char,std::char_traits<char>>(poVar14);
        goto LAB_0010b18d;
      }
      this->curSymInd = this->curSymInd + 1;
      uStack_130._0_4_ = 0;
      uStack_130._4_4_ = 0;
      local_128 = 0.0;
      local_148._0_4_ = 0;
      local_148._4_4_ = 0;
      puStack_140 = (_Bit_pointer)0x0;
      local_158._M_allocated_capacity = 0;
      local_158._8_8_ = 0;
      local_168._8_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)0x0;
      local_138._0_4_ = 0;
      local_138._4_4_ = 0;
      uStack_120._0_1_ = false;
      uStack_120._1_1_ = true;
      uStack_120._2_6_ = 0;
      local_168._0_8_ = &local_158;
      std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::
      emplace_back<SymbolTableElement>
                ((this->st->symbolTable).
                 super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + this->curFun,
                 (SymbolTableElement *)local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._0_8_ != &local_158) {
        operator_delete((void *)local_168._0_8_,local_158._M_allocated_capacity + 1);
      }
      pvVar6 = (this->st->symbolTable).
               super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = *(long *)&pvVar6[this->curFun].
                         super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                         ._M_impl.super__Vector_impl_data;
      lVar18 = (long)((int)((ulong)((long)*(pointer *)
                                           ((long)&pvVar6[this->curFun].
                                                                                                      
                                                  super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                                  ._M_impl.super__Vector_impl_data + 8) - lVar13) >>
                           4) * -0x33333333 + -1) * 0x50;
      std::__cxx11::string::_M_assign((string *)(lVar13 + lVar18));
      *(undefined4 *)
       (*(long *)&(this->st->symbolTable).
                  super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                  super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                  _M_impl.super__Vector_impl_data + 0x24 + lVar18) = 3;
      lVar13 = (long)this->curIndex + 1;
      this->curIndex = (int)lVar13;
      if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar13].type == DELIMTER) {
        pDVar3 = this->delimiterTable;
        local_168._0_8_ = &local_158;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"[","");
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&(pDVar3->
                                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).index,(key_type *)local_168);
        iVar8 = *pmVar11;
        iVar15 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start[this->curIndex].id;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ != &local_158) {
          operator_delete((void *)local_168._0_8_,local_158._M_allocated_capacity + 1);
        }
        if (iVar8 != iVar15) goto LAB_0010aff0;
        lVar13 = (long)this->curIndex + 1;
        this->curIndex = (int)lVar13;
        pTVar4 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (pTVar4[lVar13].type != INTCONST) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,anon_var_dwarf_33aed,0x27);
          poVar14 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,
                               (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->curIndex].line);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,anon_var_dwarf_33a7e,3);
          std::endl<char,std::char_traits<char>>(poVar14);
          goto LAB_0010b18d;
        }
        pcVar7 = pTVar4[lVar13].name._M_dataplus._M_p;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar7,pcVar7 + pTVar4[lVar13].name._M_string_length);
        iVar8 = string2num<int>(&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        lVar13 = (long)this->curIndex + 1;
        this->curIndex = (int)lVar13;
        if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar13].type != DELIMTER) {
LAB_0010b259:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,anon_var_dwarf_33b11,0x21);
          poVar14 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,
                               (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->curIndex].line);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,anon_var_dwarf_33a7e,3);
          std::endl<char,std::char_traits<char>>(poVar14);
          goto LAB_0010b18d;
        }
        pDVar3 = this->delimiterTable;
        local_168._0_8_ = &local_158;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"]","");
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                  ::operator[](&(pDVar3->
                                super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).index,(key_type *)local_168);
        iVar15 = *pmVar11;
        iVar2 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[this->curIndex].id;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._0_8_ != &local_158) {
          operator_delete((void *)local_168._0_8_,local_158._M_allocated_capacity + 1);
        }
        if (iVar15 != iVar2) goto LAB_0010b259;
        this->curIndex = this->curIndex + 1;
        std::vector<QuadTuple,std::allocator<QuadTuple>>::
        emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[4],char_const(&)[3]>
                  ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                   (char (*) [7])"vardef",&local_110,(char (*) [4])"arr",(char (*) [3])"__");
        local_148._0_4_ = 0;
        local_148._4_4_ = 0;
        puStack_140 = (_Bit_pointer)0x0;
        local_158._M_allocated_capacity = 0;
        local_158._8_8_ = 0;
        local_168._0_8_ = (pointer)0x0;
        local_168._8_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)0x0;
        local_138._0_4_ = 0;
        local_138._4_4_ = 0;
        pcVar7 = (this->curType)._M_dataplus._M_p;
        pPVar21 = (Parse *)local_50;
        local_50._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)(local_50 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pPVar21,pcVar7,pcVar7 + (this->curType)._M_string_length);
        TVar9 = toType(pPVar21,(string *)local_50);
        local_138._0_4_ = TVar9;
        if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_50._0_8_ !=
            (vector<QuadTuple,_std::allocator<QuadTuple>_> *)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
        }
        local_168._4_4_ = iVar8 + -1;
        pcVar7 = (this->curType)._M_dataplus._M_p;
        pPVar21 = (Parse *)local_70;
        local_70._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pPVar21,pcVar7,pcVar7 + (this->curType)._M_string_length);
        uVar10 = typeSize(pPVar21,(string *)local_70);
        local_138._4_4_ = uVar10;
        if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_70._0_8_ !=
            (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_60) {
          operator_delete((void *)local_70._0_8_,(ulong)(local_60._0_8_ + 1));
        }
        uVar10 = 0xffffffff;
        do {
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)(local_168 + 8),true);
          uVar10 = uVar10 + 1;
        } while (uVar10 < (uint)local_168._4_4_);
        std::vector<ArrayInfo,_std::allocator<ArrayInfo>_>::push_back
                  (&this->st->arrayTableVec,(value_type *)local_168);
        pSVar16 = this->st;
        lVar13 = *(long *)&(pSVar16->symbolTable).
                           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                           super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                           ._M_impl.super__Vector_impl_data;
        *(undefined4 *)(lVar13 + 0x20 + lVar18) = 5;
        *(int *)(lVar13 + 0x30 + lVar18) =
             (int)((ulong)((long)(pSVar16->arrayTableVec).
                                 super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)(pSVar16->arrayTableVec).
                                super__Vector_base<ArrayInfo,_std::allocator<ArrayInfo>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3) * -0x49249249 + -1;
        *(uint *)(lVar13 + 0x2c + lVar18) = iVar8 * local_138._4_4_;
        if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_168._8_8_ ==
            (vector<QuadTuple,_std::allocator<QuadTuple>_> *)0x0) goto LAB_0010b10b;
        puVar19 = (undefined1 *)((long)puStack_140 - local_168._8_8_);
        pvVar22 = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_168._8_8_;
      }
      else {
LAB_0010aff0:
        std::vector<QuadTuple,std::allocator<QuadTuple>>::
        emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string&,char_const(&)[3]>
                  ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,
                   (char (*) [7])"vardef",&local_110,&this->curType,(char (*) [3])"--");
        pcVar7 = (this->curType)._M_dataplus._M_p;
        pPVar21 = (Parse *)local_90;
        local_90._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_80;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pPVar21,pcVar7,pcVar7 + (this->curType)._M_string_length);
        TVar9 = toType(pPVar21,(string *)local_90);
        pSVar16 = this->st;
        lVar17 = (long)this->curFun;
        lVar13 = *(long *)&(pSVar16->symbolTable).
                           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar17].
                           super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                           ._M_impl.super__Vector_impl_data;
        *(Type *)(lVar13 + 0x20 + lVar18) = TVar9;
        if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_90._0_8_ !=
            (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_80) {
          operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
          pSVar16 = this->st;
          lVar17 = (long)this->curFun;
          lVar13 = *(long *)&(pSVar16->symbolTable).
                             super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar17].
                             super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                             ._M_impl.super__Vector_impl_data;
        }
        *(int *)(lVar13 + 0x34 + lVar18) =
             (pSVar16->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar17];
        pcVar7 = (this->curType)._M_dataplus._M_p;
        pPVar21 = (Parse *)local_b0;
        local_b0._0_8_ = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_a0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pPVar21,pcVar7,pcVar7 + (this->curType)._M_string_length);
        uVar10 = typeSize(pPVar21,(string *)local_b0);
        piVar1 = (this->st->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + this->curFun;
        *piVar1 = *piVar1 + uVar10;
        if ((vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_b0._0_8_ ==
            (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_a0) goto LAB_0010b10b;
        puVar19 = (undefined1 *)(local_a0._0_8_ + 1);
        pvVar22 = (vector<QuadTuple,_std::allocator<QuadTuple>_> *)local_b0._0_8_;
      }
      operator_delete(pvVar22,(ulong)puVar19);
LAB_0010b10b:
      varDeclarationList(this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      return 1;
    }
    pcVar20 = anon_var_dwarf_33a55;
  }
  else {
LAB_0010b141:
    pcVar20 = anon_var_dwarf_33b7a;
  }
  poVar14 = std::operator<<((ostream *)&std::cout,pcVar20);
  poVar14 = (ostream *)
            std::ostream::operator<<
                      (poVar14,(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>).
                               _M_impl.super__Vector_impl_data._M_start[this->curIndex].line);
  poVar14 = std::operator<<(poVar14,anon_var_dwarf_33a7e);
  std::endl<char,std::char_traits<char>>(poVar14);
LAB_0010b18d:
  exit(0);
}

Assistant:

int Parse::varDeclarationList() {
    int index = curIndex;
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[","] == tokenVec[curIndex].id) {
        curIndex++;
            if(tokenVec[curIndex].type != TokenType::IDENTIFIER) {
                cout << "类型声明后必须跟着标识符在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            string curName = tokenVec[curIndex].name;
            int stIndex = 0;
            stIndex = st.searchSymbolName(tokenVec[curIndex].name, curFun);
            if(stIndex >= 0) {
//            cout << tokenVec[curIndex].name << endl;
                cout << "变量"<<  tokenVec[curIndex].name <<"重定义" << "在第" << tokenVec[curIndex].line  << "行" << endl;
                exit(0);
            }

            curSymInd++;
            st.symbolTable[curFun].emplace_back(SymbolTableElement());
            int symind = static_cast<int>(st.symbolTable[curFun].size() - 1);
            st.symbolTable[curFun][symind].name = curName;
            st.symbolTable[curFun][symind].cat = Category::VARIABLE;


            bool arrayFlag = false;
            curIndex++;
            int arrLen = 0;

            if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["["] == tokenVec[curIndex].id) {
                curIndex++;
                if(tokenVec[curIndex].type ==  INTCONST) {
                    arrLen = string2num<int >(tokenVec[curIndex].name);
                    curIndex++;
                } else {
                    cout << "数组长度必须是整型变量在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["]"] == tokenVec[curIndex].id) {
                    curIndex++;
                } else {
                    cout << "数组声明缺少右括号在第" << tokenVec[curIndex].line << "行" << endl;
                    exit(0);
                }
                arrayFlag = true;
            }
            if(arrayFlag) {
                quadVec.emplace_back("vardef", curName, "arr", "__");
                ArrayInfo arrayInfoEle{};
                arrayInfoEle.low = 0;
                arrayInfoEle.type = toType(curType);
                arrayInfoEle.up = static_cast<unsigned int>(arrLen - 1);
                arrayInfoEle.clen = typeSize(curType);
                for(int ind = arrayInfoEle.low ; ind <= arrayInfoEle.up; ind++) {
                    arrayInfoEle.activeMess.push_back(true);
                }
                st.arrayTableVec.push_back(arrayInfoEle);
                st.symbolTable[curFun][symind].type = ARRAY;
                st.symbolTable[curFun][symind].aiInd = static_cast<int>(st.arrayTableVec.size() - 1);
                st.symbolTable[curFun][symind].len = arrayInfoEle.clen * arrLen;
            }else {
                quadVec.emplace_back("vardef", curName, curType, "--");
                st.symbolTable[curFun][symind].type = toType(curType);
                st.symbolTable[curFun][symind].vall = st.vallVec[curFun];
                st.vallVec[curFun] += typeSize(curType);
            }
            varDeclarationList();
    } else if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
        curIndex++;
        return 1;
    } else {
        cout << "变量声明缺少;" << tokenVec[curIndex].line  << "行" << endl;
        exit(0);
    }
    return 1;
}